

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

void envy_bios_print_xpio(envy_bios *bios,FILE *out,envy_bios_xpio *xpio,int idx,uint mask)

{
  char *pcVar1;
  envy_bios_gpio_entry *peVar2;
  envy_bios_gpio_entry *entry;
  int i;
  char *typename;
  uint mask_local;
  int idx_local;
  envy_bios_xpio *xpio_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  if (xpio->offset != 0) {
    if (xpio->valid == '\0') {
      fprintf((FILE *)out,"Failed to parse XPIO table at 0x%04x version %d.%d\n\n",
              (ulong)xpio->offset,(ulong)(uint)((int)(uint)xpio->version >> 4),
              (ulong)(xpio->version & 0xf));
    }
    else {
      pcVar1 = find_enum(xpio_types,(uint)xpio->type);
      fprintf((FILE *)out,"XPIO table %d at 0x%04x version %d.%d",(ulong)(uint)idx,
              (ulong)xpio->offset,(ulong)(uint)((int)(uint)xpio->version >> 4),
              (ulong)(xpio->version & 0xf));
      fprintf((FILE *)out," type 0x%02x [%s]",(ulong)xpio->type,pcVar1);
      fprintf((FILE *)out," at 0x%02x defbus %d",(ulong)xpio->addr,(ulong)xpio->bus);
      if (xpio->unk02_0 != '\0') {
        fprintf((FILE *)out," unk02_0 %d",(ulong)xpio->unk02_0);
      }
      if (xpio->unk02_5 != '\0') {
        fprintf((FILE *)out," unk02_5 %d",(ulong)xpio->unk02_5);
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)xpio->offset,(uint)xpio->hlen,mask);
      for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)xpio->entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = xpio->entries + (int)entry._4_4_;
        if ((peVar2->tag != '\0') || ((mask & 0x40000000) != 0)) {
          fprintf((FILE *)out,"XPIO %d:",(ulong)entry._4_4_);
          fprintf((FILE *)out," line %d",(ulong)peVar2->line);
          if (peVar2->tag == '\0') {
            fprintf((FILE *)out," UNUSED");
          }
          else {
            fprintf((FILE *)out," tag 0x%02x",(ulong)peVar2->tag);
          }
          if ((peVar2->log[0] == '\0') && (peVar2->log[1] == '\x01')) {
            fprintf((FILE *)out," OUT");
          }
          else if ((peVar2->log[0] == '\x01') && (peVar2->log[1] == '\0')) {
            fprintf((FILE *)out," OUT NEG");
          }
          else if ((peVar2->log[0] == '\x02') && (peVar2->log[1] == '\x03')) {
            fprintf((FILE *)out," IN");
          }
          else if ((peVar2->log[0] == '\x03') && (peVar2->log[1] == '\x02')) {
            fprintf((FILE *)out," IN NEG");
          }
          else {
            fprintf((FILE *)out," LOG %d/%d",(ulong)peVar2->log[0],(ulong)peVar2->log[1]);
          }
          if (0x3f < (bios->gpio).version) {
            fprintf((FILE *)out," DEF %d",(ulong)peVar2->def);
          }
          if (peVar2->mode != '\0') {
            fprintf((FILE *)out," SPEC %d [???]",(ulong)peVar2->mode);
          }
          if (peVar2->param != '\0') {
            fprintf((FILE *)out," param 1");
          }
          if (peVar2->unk40_0 != '\0') {
            fprintf((FILE *)out," unk40_0 %d",(ulong)peVar2->unk40_0);
          }
          if (peVar2->unk40_2 != '\0') {
            fprintf((FILE *)out," unk40_2 0x%02x",(ulong)peVar2->unk40_2);
          }
          if (peVar2->spec_out != '\0') {
            fprintf((FILE *)out," SPEC_OUT 0x%02x",(ulong)peVar2->spec_out);
          }
          if (((bios->gpio).version == 'A') && (peVar2->lockpin != '\x0f')) {
            fprintf((FILE *)out," lockpin %d",(ulong)peVar2->lockpin);
          }
          if (peVar2->spec_in != '\0') {
            fprintf((FILE *)out," SPEC_IN 0x%02x",(ulong)(peVar2->spec_in - 1));
          }
          if (peVar2->gsync != '\0') {
            fprintf((FILE *)out," gsync %d",(ulong)peVar2->gsync);
          }
          fprintf((FILE *)out,"\n");
        }
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)xpio->rlen,mask);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_xpio (struct envy_bios *bios, FILE *out, struct envy_bios_xpio *xpio, int idx, unsigned mask) {
	if (!xpio->offset)
		return;
	if (!xpio->valid) {
		fprintf(out, "Failed to parse XPIO table at 0x%04x version %d.%d\n\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
		return;
	}
	const char *typename = find_enum(xpio_types, xpio->type);
	fprintf(out, "XPIO table %d at 0x%04x version %d.%d", idx, xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	fprintf(out, " type 0x%02x [%s]", xpio->type, typename);
	fprintf(out, " at 0x%02x defbus %d", xpio->addr, xpio->bus);
	if (xpio->unk02_0)
		fprintf(out, " unk02_0 %d", xpio->unk02_0);
	if (xpio->unk02_5)
		fprintf(out, " unk02_5 %d", xpio->unk02_5);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, xpio->offset, xpio->hlen, mask);
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		if (entry->tag || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "XPIO %d:", i);
			fprintf(out, " line %d", entry->line);
			if (entry->tag)
				fprintf(out, " tag 0x%02x", entry->tag);
			else
				fprintf(out, " UNUSED");
			if (entry->log[0] == 0 && entry->log[1] == 1) {
				fprintf(out, " OUT");
			} else if (entry->log[0] == 1 && entry->log[1] == 0) {
				fprintf(out, " OUT NEG");
			} else if (entry->log[0] == 2 && entry->log[1] == 3) {
				fprintf(out, " IN");
			} else if (entry->log[0] == 3 && entry->log[1] == 2) {
				fprintf(out, " IN NEG");
			} else {
				fprintf(out, " LOG %d/%d", entry->log[0], entry->log[1]);
			}
			if (bios->gpio.version >= 0x40)
				fprintf(out, " DEF %d", entry->def);
			if (entry->mode)
				fprintf(out, " SPEC %d [???]", entry->mode);
			if (entry->param)
				fprintf(out, " param 1");
			if (entry->unk40_0)
				fprintf(out, " unk40_0 %d", entry->unk40_0);
			if (entry->unk40_2)
				fprintf(out, " unk40_2 0x%02x", entry->unk40_2);
			if (entry->spec_out)
				fprintf(out, " SPEC_OUT 0x%02x", entry->spec_out);
			if (bios->gpio.version == 0x41 && entry->lockpin != 15)
				fprintf(out, " lockpin %d", entry->lockpin);
			if (entry->spec_in)
				fprintf(out, " SPEC_IN 0x%02x", entry->spec_in-1);
			if (entry->gsync)
				fprintf(out, " gsync %d", entry->gsync);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, xpio->rlen, mask);
	}
	fprintf(out, "\n");
}